

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::~CommandLineInterfaceTester
          (CommandLineInterfaceTester *this)

{
  string *name;
  bool bVar1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_0053a570;
  name = &this->temp_directory_;
  bVar1 = File::Exists(name);
  if (bVar1) {
    File::DeleteRecursively(name,(void *)0x0,(void *)0x0);
  }
  std::
  vector<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ::~vector(&this->generators_);
  std::__cxx11::string::~string((string *)&this->captured_stdout_);
  std::__cxx11::string::~string((string *)&this->captured_stderr_);
  std::__cxx11::string::~string((string *)name);
  CommandLineInterface::~CommandLineInterface(&this->cli_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

CommandLineInterfaceTester::~CommandLineInterfaceTester() {
  // Delete the temp directory.
  if (FileExists(temp_directory_)) {
    File::DeleteRecursively(temp_directory_, NULL, NULL);
  }
}